

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O0

void __thiscall
luna::CallCFuncException::CallCFuncException<char_const(&)[8],int&,char_const(&)[11]>
          (CallCFuncException *this,char (*args) [8],int *args_1,char (*args_2) [11])

{
  char (*in_stack_00000178) [11];
  int *in_stack_00000180;
  char (*in_stack_00000188) [8];
  Exception *in_stack_00000190;
  
  Exception::Exception((Exception *)0x1f0696);
  Exception::SetWhat<char_const(&)[8],int&,char_const(&)[11]>
            (in_stack_00000190,in_stack_00000188,in_stack_00000180,in_stack_00000178);
  return;
}

Assistant:

CallCFuncException(Args&&... args)
        {
            SetWhat(std::forward<Args>(args)...);
        }